

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O3

int test_debugXML(void)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  FILE *pFVar16;
  xmlDocPtr pxVar17;
  xmlAttrPtr pxVar18;
  xmlDtdPtr val;
  xmlNodePtr pxVar19;
  xmlNodePtr pxVar20;
  xmlNodePtr pxVar21;
  xmlXPathObjectPtr pxVar22;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  int extraout_EDX_05;
  int extraout_EDX_06;
  int nr;
  int extraout_EDX_07;
  int extraout_EDX_08;
  int nr_00;
  int nr_01;
  int nr_02;
  int nr_03;
  int nr_04;
  int nr_05;
  int nr_06;
  int nr_07;
  int nr_08;
  int nr_09;
  int nr_10;
  int nr_11;
  int nr_12;
  int nr_13;
  int nr_14;
  int nr_15;
  int nr_16;
  int nr_17;
  int nr_18;
  int nr_19;
  int n_doc_2;
  ulong uVar23;
  bool bVar24;
  int n_node_3;
  uint uVar25;
  int n_depth_2;
  undefined4 *puVar26;
  undefined8 uVar27;
  ulong uVar28;
  int n_doc;
  int iVar29;
  int n_depth;
  uint uVar30;
  int no;
  undefined8 *puVar31;
  int test_ret_4;
  int test_ret_1;
  int test_ret;
  int test_ret_5;
  int test_ret_3;
  undefined8 local_58;
  int local_40;
  int local_34;
  
  if (quiet == '\0') {
    puts("Testing debugXML : 25 of 28 functions ...");
  }
  puVar26 = &DAT_0016343c;
  uVar23 = 0;
  iVar29 = 0;
  do {
    iVar3 = xmlMemBlocks();
    xmlBoolToText(*puVar26);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar4 = xmlMemBlocks();
    if (iVar3 != iVar4) {
      iVar4 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlBoolToText",(ulong)(uint)(iVar4 - iVar3));
      iVar29 = iVar29 + 1;
      printf(" %d",uVar23);
      putchar(10);
    }
    uVar25 = (int)uVar23 + 1;
    uVar23 = (ulong)uVar25;
    puVar26 = puVar26 + 1;
  } while (uVar25 != 4);
  function_tests = function_tests + 1;
  iVar3 = 0;
  uVar27 = 0;
  bVar1 = true;
  do {
    bVar2 = bVar1;
    uVar25 = 0;
    do {
      iVar4 = xmlMemBlocks();
      iVar5 = 0x1559b7;
      pFVar16 = fopen64("test.out","a+");
      pxVar17 = gen_xmlDocPtr(uVar25,iVar5);
      xmlDebugCheckDocument(pFVar16,pxVar17);
      call_tests = call_tests + 1;
      if (pFVar16 != (FILE *)0x0) {
        fclose(pFVar16);
      }
      if (((pxVar17 != (xmlDocPtr)0x0) && (api_doc != pxVar17)) && (pxVar17->doc != api_doc)) {
        xmlFreeDoc(pxVar17);
      }
      xmlResetLastError();
      iVar5 = xmlMemBlocks();
      if (iVar4 != iVar5) {
        iVar5 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlDebugCheckDocument",(ulong)(uint)(iVar5 - iVar4));
        iVar3 = iVar3 + 1;
        printf(" %d",uVar27);
        printf(" %d",(ulong)uVar25);
        putchar(10);
      }
      uVar25 = uVar25 + 1;
    } while (uVar25 != 4);
    uVar27 = 1;
    bVar1 = false;
  } while (bVar2);
  function_tests = function_tests + 1;
  iVar4 = 0;
  local_58 = 0;
  bVar1 = true;
  do {
    bVar2 = bVar1;
    uVar25 = 0;
    bVar1 = true;
    do {
      bVar24 = bVar1;
      puVar26 = &DAT_0016343c;
      uVar23 = 0;
      do {
        iVar5 = xmlMemBlocks();
        iVar6 = 0x1559b7;
        pFVar16 = fopen64("test.out","a+");
        pxVar18 = gen_xmlAttrPtr(uVar25,iVar6);
        xmlDebugDumpAttr(pFVar16,pxVar18,*puVar26);
        call_tests = call_tests + 1;
        if (pFVar16 != (FILE *)0x0) {
          fclose(pFVar16);
        }
        if (bVar24) {
          xmlFreeDoc(api_doc);
          api_doc = (xmlDocPtr)0x0;
          api_dtd = (xmlDtdPtr)0x0;
          api_root = (xmlNodePtr)0x0;
          api_ns = (xmlNsPtr)0x0;
        }
        xmlResetLastError();
        iVar6 = xmlMemBlocks();
        if (iVar5 != iVar6) {
          iVar6 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlDebugDumpAttr",(ulong)(uint)(iVar6 - iVar5));
          iVar4 = iVar4 + 1;
          printf(" %d",local_58);
          printf(" %d",(ulong)uVar25);
          printf(" %d",uVar23);
          putchar(10);
        }
        uVar30 = (int)uVar23 + 1;
        uVar23 = (ulong)uVar30;
        puVar26 = puVar26 + 1;
      } while (uVar30 != 4);
      uVar25 = 1;
      bVar1 = false;
    } while (bVar24);
    local_58 = 1;
    bVar1 = false;
  } while (bVar2);
  function_tests = function_tests + 1;
  iVar5 = 0;
  local_58 = 0;
  bVar1 = true;
  do {
    bVar2 = bVar1;
    uVar25 = 0;
    bVar1 = true;
    do {
      bVar24 = bVar1;
      puVar26 = &DAT_0016343c;
      uVar23 = 0;
      do {
        iVar6 = xmlMemBlocks();
        iVar7 = 0x1559b7;
        pFVar16 = fopen64("test.out","a+");
        pxVar18 = gen_xmlAttrPtr(uVar25,iVar7);
        xmlDebugDumpAttrList(pFVar16,pxVar18,*puVar26);
        call_tests = call_tests + 1;
        if (pFVar16 != (FILE *)0x0) {
          fclose(pFVar16);
        }
        if (bVar24) {
          xmlFreeDoc(api_doc);
          api_doc = (xmlDocPtr)0x0;
          api_dtd = (xmlDtdPtr)0x0;
          api_root = (xmlNodePtr)0x0;
          api_ns = (xmlNsPtr)0x0;
        }
        xmlResetLastError();
        iVar7 = xmlMemBlocks();
        if (iVar6 != iVar7) {
          iVar7 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlDebugDumpAttrList",(ulong)(uint)(iVar7 - iVar6));
          iVar5 = iVar5 + 1;
          printf(" %d",local_58);
          printf(" %d",(ulong)uVar25);
          printf(" %d",uVar23);
          putchar(10);
        }
        uVar30 = (int)uVar23 + 1;
        uVar23 = (ulong)uVar30;
        puVar26 = puVar26 + 1;
      } while (uVar30 != 4);
      uVar25 = 1;
      bVar1 = false;
    } while (bVar24);
    local_58 = 1;
    bVar1 = false;
  } while (bVar2);
  function_tests = function_tests + 1;
  local_34 = 0;
  uVar25 = 0;
  bVar1 = true;
  do {
    bVar2 = bVar1;
    uVar30 = 0;
    do {
      iVar7 = xmlMemBlocks();
      iVar6 = 0x1559b7;
      pFVar16 = fopen64("test.out","a+");
      val = gen_xmlDtdPtr(uVar30,iVar6);
      xmlDebugDumpDTD(pFVar16,val);
      call_tests = call_tests + 1;
      iVar6 = extraout_EDX;
      if (pFVar16 != (FILE *)0x0) {
        fclose(pFVar16);
        iVar6 = extraout_EDX_00;
      }
      des_xmlDtdPtr(uVar30,val,iVar6);
      xmlResetLastError();
      iVar6 = xmlMemBlocks();
      if (iVar7 != iVar6) {
        iVar6 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlDebugDumpDTD",(ulong)(uint)(iVar6 - iVar7));
        local_34 = local_34 + 1;
        printf(" %d",(ulong)uVar25);
        printf(" %d",(ulong)uVar30);
        putchar(10);
      }
      uVar30 = uVar30 + 1;
    } while (uVar30 != 3);
    uVar25 = 1;
    bVar1 = false;
  } while (bVar2);
  function_tests = function_tests + 1;
  iVar6 = 0;
  uVar25 = 0;
  bVar1 = true;
  do {
    bVar2 = bVar1;
    uVar30 = 0;
    do {
      iVar7 = xmlMemBlocks();
      iVar8 = 0x1559b7;
      pFVar16 = fopen64("test.out","a+");
      pxVar17 = gen_xmlDocPtr(uVar30,iVar8);
      xmlDebugDumpDocument(pFVar16,pxVar17);
      call_tests = call_tests + 1;
      if (pFVar16 != (FILE *)0x0) {
        fclose(pFVar16);
      }
      if (((pxVar17 != (xmlDocPtr)0x0) && (api_doc != pxVar17)) && (pxVar17->doc != api_doc)) {
        xmlFreeDoc(pxVar17);
      }
      xmlResetLastError();
      iVar8 = xmlMemBlocks();
      if (iVar7 != iVar8) {
        iVar8 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlDebugDumpDocument",(ulong)(uint)(iVar8 - iVar7));
        iVar6 = iVar6 + 1;
        printf(" %d",(ulong)uVar25);
        printf(" %d",(ulong)uVar30);
        putchar(10);
      }
      uVar30 = uVar30 + 1;
    } while (uVar30 != 4);
    uVar25 = 1;
    bVar1 = false;
  } while (bVar2);
  function_tests = function_tests + 1;
  local_40 = 0;
  uVar25 = 0;
  bVar1 = true;
  do {
    bVar2 = bVar1;
    uVar23 = 0;
    do {
      iVar7 = xmlMemBlocks();
      iVar8 = 0x1559b7;
      pFVar16 = fopen64("test.out","a+");
      pxVar17 = gen_xmlDocPtr((int)uVar23,iVar8);
      xmlDebugDumpDocumentHead(pFVar16,pxVar17);
      call_tests = call_tests + 1;
      if (pFVar16 != (FILE *)0x0) {
        fclose(pFVar16);
      }
      if (((pxVar17 != (xmlDocPtr)0x0) && (api_doc != pxVar17)) && (pxVar17->doc != api_doc)) {
        xmlFreeDoc(pxVar17);
      }
      xmlResetLastError();
      iVar8 = xmlMemBlocks();
      if (iVar7 != iVar8) {
        iVar8 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlDebugDumpDocumentHead",(ulong)(uint)(iVar8 - iVar7));
        local_40 = local_40 + 1;
        printf(" %d",(ulong)uVar25);
        printf(" %d",uVar23);
        putchar(10);
      }
      uVar30 = (int)uVar23 + 1;
      uVar23 = (ulong)uVar30;
    } while (uVar30 != 4);
    uVar25 = 1;
    bVar1 = false;
  } while (bVar2);
  function_tests = function_tests + 1;
  iVar29 = iVar3 + iVar29 + iVar4 + iVar5 + local_34;
  iVar3 = 0;
  uVar25 = 0;
  bVar1 = true;
  do {
    bVar2 = bVar1;
    uVar23 = 0;
    do {
      iVar4 = xmlMemBlocks();
      iVar5 = 0x1559b7;
      pFVar16 = fopen64("test.out","a+");
      pxVar17 = gen_xmlDocPtr((int)uVar23,iVar5);
      xmlDebugDumpEntities(pFVar16,pxVar17);
      call_tests = call_tests + 1;
      if (pFVar16 != (FILE *)0x0) {
        fclose(pFVar16);
      }
      if (((pxVar17 != (xmlDocPtr)0x0) && (api_doc != pxVar17)) && (pxVar17->doc != api_doc)) {
        xmlFreeDoc(pxVar17);
      }
      xmlResetLastError();
      iVar5 = xmlMemBlocks();
      if (iVar4 != iVar5) {
        iVar5 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlDebugDumpEntities",(ulong)(uint)(iVar5 - iVar4));
        iVar3 = iVar3 + 1;
        printf(" %d",(ulong)uVar25);
        printf(" %d",uVar23);
        putchar(10);
      }
      uVar30 = (int)uVar23 + 1;
      uVar23 = (ulong)uVar30;
    } while (uVar30 != 4);
    uVar25 = 1;
    bVar1 = false;
  } while (bVar2);
  function_tests = function_tests + 1;
  iVar4 = 0;
  local_58 = 0;
  bVar1 = true;
  do {
    bVar2 = bVar1;
    uVar23 = 0;
    do {
      puVar26 = &DAT_0016343c;
      uVar28 = 0;
      do {
        iVar7 = xmlMemBlocks();
        iVar5 = 0x1559b7;
        pFVar16 = fopen64("test.out","a+");
        iVar8 = (int)uVar23;
        pxVar19 = gen_xmlNodePtr(iVar8,iVar5);
        xmlDebugDumpNode(pFVar16,pxVar19,*puVar26);
        call_tests = call_tests + 1;
        iVar5 = extraout_EDX_01;
        if (pFVar16 != (FILE *)0x0) {
          fclose(pFVar16);
          iVar5 = extraout_EDX_02;
        }
        des_xmlNodePtr(iVar8,pxVar19,iVar5);
        xmlResetLastError();
        iVar5 = xmlMemBlocks();
        if (iVar7 != iVar5) {
          iVar5 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlDebugDumpNode",(ulong)(uint)(iVar5 - iVar7));
          iVar4 = iVar4 + 1;
          printf(" %d",local_58);
          printf(" %d",uVar23);
          printf(" %d",uVar28);
          putchar(10);
        }
        uVar25 = (int)uVar28 + 1;
        uVar28 = (ulong)uVar25;
        puVar26 = puVar26 + 1;
      } while (uVar25 != 4);
      uVar23 = (ulong)(iVar8 + 1U);
    } while (iVar8 + 1U != 3);
    local_58 = 1;
    bVar1 = false;
  } while (bVar2);
  function_tests = function_tests + 1;
  iVar5 = 0;
  local_58 = 0;
  bVar1 = true;
  do {
    bVar2 = bVar1;
    uVar23 = 0;
    do {
      puVar26 = &DAT_0016343c;
      uVar28 = 0;
      do {
        iVar8 = xmlMemBlocks();
        iVar7 = 0x1559b7;
        pFVar16 = fopen64("test.out","a+");
        iVar9 = (int)uVar23;
        pxVar19 = gen_xmlNodePtr(iVar9,iVar7);
        xmlDebugDumpNodeList(pFVar16,pxVar19,*puVar26);
        call_tests = call_tests + 1;
        iVar7 = extraout_EDX_03;
        if (pFVar16 != (FILE *)0x0) {
          fclose(pFVar16);
          iVar7 = extraout_EDX_04;
        }
        des_xmlNodePtr(iVar9,pxVar19,iVar7);
        xmlResetLastError();
        iVar7 = xmlMemBlocks();
        if (iVar8 != iVar7) {
          iVar7 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlDebugDumpNodeList",(ulong)(uint)(iVar7 - iVar8));
          iVar5 = iVar5 + 1;
          printf(" %d",local_58);
          printf(" %d",uVar23);
          printf(" %d",uVar28);
          putchar(10);
        }
        uVar25 = (int)uVar28 + 1;
        uVar28 = (ulong)uVar25;
        puVar26 = puVar26 + 1;
      } while (uVar25 != 4);
      uVar23 = (ulong)(iVar9 + 1U);
    } while (iVar9 + 1U != 3);
    local_58 = 1;
    bVar1 = false;
  } while (bVar2);
  function_tests = function_tests + 1;
  iVar7 = 0;
  local_58 = 0;
  bVar1 = true;
  do {
    bVar2 = bVar1;
    uVar23 = 0;
    do {
      puVar26 = &DAT_0016343c;
      uVar28 = 0;
      do {
        iVar9 = xmlMemBlocks();
        iVar8 = 0x1559b7;
        pFVar16 = fopen64("test.out","a+");
        iVar10 = (int)uVar23;
        pxVar19 = gen_xmlNodePtr(iVar10,iVar8);
        xmlDebugDumpOneNode(pFVar16,pxVar19,*puVar26);
        call_tests = call_tests + 1;
        iVar8 = extraout_EDX_05;
        if (pFVar16 != (FILE *)0x0) {
          fclose(pFVar16);
          iVar8 = extraout_EDX_06;
        }
        des_xmlNodePtr(iVar10,pxVar19,iVar8);
        xmlResetLastError();
        iVar8 = xmlMemBlocks();
        if (iVar9 != iVar8) {
          iVar8 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlDebugDumpOneNode",(ulong)(uint)(iVar8 - iVar9));
          iVar7 = iVar7 + 1;
          printf(" %d",local_58);
          printf(" %d",uVar23);
          printf(" %d",uVar28);
          putchar(10);
        }
        uVar25 = (int)uVar28 + 1;
        uVar28 = (ulong)uVar25;
        puVar26 = puVar26 + 1;
      } while (uVar25 != 4);
      uVar23 = (ulong)(iVar10 + 1U);
    } while (iVar10 + 1U != 3);
    local_58 = 1;
    bVar1 = false;
  } while (bVar2);
  function_tests = function_tests + 1;
  iVar8 = 0;
  uVar25 = 0;
  bVar1 = true;
  do {
    bVar2 = bVar1;
    pxVar19 = (xmlNodePtr)0x0;
    puVar31 = &DAT_00165d70;
    do {
      iVar9 = xmlMemBlocks();
      pFVar16 = fopen64("test.out","a+");
      uVar30 = (uint)pxVar19;
      if (uVar30 < 4) {
        pxVar20 = (xmlNodePtr)*puVar31;
      }
      else {
        pxVar20 = (xmlNodePtr)0x0;
      }
      xmlDebugDumpString(pFVar16);
      call_tests = call_tests + 1;
      if (pFVar16 != (FILE *)0x0) {
        fclose(pFVar16);
      }
      xmlResetLastError();
      iVar10 = xmlMemBlocks();
      if (iVar9 != iVar10) {
        iVar10 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlDebugDumpString",(ulong)(uint)(iVar10 - iVar9));
        iVar8 = iVar8 + 1;
        printf(" %d",(ulong)uVar25);
        printf(" %d");
        putchar(10);
        pxVar20 = pxVar19;
      }
      uVar30 = uVar30 + 1;
      pxVar19 = (xmlNodePtr)(ulong)uVar30;
      puVar31 = puVar31 + 1;
    } while (uVar30 != 5);
    uVar25 = 1;
    bVar1 = false;
  } while (bVar2);
  function_tests = function_tests + 1;
  uVar25 = 0;
  local_34 = 0;
  do {
    iVar10 = (int)pxVar20;
    iVar9 = xmlMemBlocks();
    pxVar20 = gen_xmlNodePtr(uVar25,iVar10);
    xmlLsCountNode(pxVar20);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar25,pxVar20,nr);
    xmlResetLastError();
    iVar10 = xmlMemBlocks();
    if (iVar9 != iVar10) {
      iVar10 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlLsCountNode",(ulong)(uint)(iVar10 - iVar9));
      local_34 = local_34 + 1;
      pxVar20 = (xmlNodePtr)(ulong)uVar25;
      printf(" %d");
      putchar(10);
    }
    uVar25 = uVar25 + 1;
  } while (uVar25 != 3);
  function_tests = function_tests + 1;
  iVar9 = 0;
  uVar25 = 0;
  bVar1 = true;
  do {
    bVar2 = bVar1;
    uVar30 = 0;
    do {
      iVar11 = xmlMemBlocks();
      iVar10 = 0x1559b7;
      pFVar16 = fopen64("test.out","a+");
      pxVar19 = gen_xmlNodePtr(uVar30,iVar10);
      xmlLsOneNode(pFVar16,pxVar19);
      call_tests = call_tests + 1;
      iVar10 = extraout_EDX_07;
      if (pFVar16 != (FILE *)0x0) {
        fclose(pFVar16);
        iVar10 = extraout_EDX_08;
      }
      des_xmlNodePtr(uVar30,pxVar19,iVar10);
      xmlResetLastError();
      iVar10 = xmlMemBlocks();
      if (iVar11 != iVar10) {
        iVar10 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlLsOneNode",(ulong)(uint)(iVar10 - iVar11));
        iVar9 = iVar9 + 1;
        printf(" %d",(ulong)uVar25);
        pxVar19 = (xmlNodePtr)(ulong)uVar30;
        printf(" %d");
        putchar(10);
      }
      uVar30 = uVar30 + 1;
    } while (uVar30 != 3);
    uVar25 = 1;
    bVar1 = false;
  } while (bVar2);
  function_tests = function_tests + 1;
  iVar10 = 0;
  uVar25 = 0;
  do {
    pxVar20 = (xmlNodePtr)0x0;
    do {
      iVar12 = (int)pxVar19;
      iVar11 = xmlMemBlocks();
      pxVar21 = gen_xmlNodePtr(uVar25,iVar12);
      iVar13 = (int)pxVar20;
      pxVar19 = gen_xmlNodePtr(iVar13,iVar12);
      xmlShellBase(0,0,pxVar21,pxVar19);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar25,pxVar21,nr_00);
      des_xmlNodePtr(iVar13,pxVar19,nr_01);
      xmlResetLastError();
      iVar12 = xmlMemBlocks();
      if (iVar11 != iVar12) {
        iVar12 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlShellBase",(ulong)(uint)(iVar12 - iVar11));
        iVar10 = iVar10 + 1;
        printf(" %d",0);
        printf(" %d",0);
        printf(" %d",(ulong)uVar25);
        printf(" %d");
        putchar(10);
        pxVar19 = pxVar20;
      }
      pxVar20 = (xmlNodePtr)(ulong)(iVar13 + 1U);
    } while (iVar13 + 1U != 3);
    uVar25 = uVar25 + 1;
  } while (uVar25 != 3);
  iVar29 = local_40 + iVar3 + iVar29 + iVar6 + iVar4 + iVar5 + iVar7 + iVar8 + local_34;
  function_tests = function_tests + 1;
  iVar3 = 0;
  uVar25 = 0;
  do {
    pxVar20 = (xmlNodePtr)0x0;
    do {
      iVar5 = (int)pxVar19;
      iVar4 = xmlMemBlocks();
      pxVar21 = gen_xmlNodePtr(uVar25,iVar5);
      iVar6 = (int)pxVar20;
      pxVar19 = gen_xmlNodePtr(iVar6,iVar5);
      xmlShellCat(0,0,pxVar21,pxVar19);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar25,pxVar21,nr_02);
      des_xmlNodePtr(iVar6,pxVar19,nr_03);
      xmlResetLastError();
      iVar5 = xmlMemBlocks();
      if (iVar4 != iVar5) {
        iVar5 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlShellCat",(ulong)(uint)(iVar5 - iVar4));
        iVar3 = iVar3 + 1;
        printf(" %d",0);
        printf(" %d",0);
        printf(" %d",(ulong)uVar25);
        printf(" %d");
        putchar(10);
        pxVar19 = pxVar20;
      }
      pxVar20 = (xmlNodePtr)(ulong)(iVar6 + 1U);
    } while (iVar6 + 1U != 3);
    uVar25 = uVar25 + 1;
  } while (uVar25 != 3);
  function_tests = function_tests + 1;
  iVar4 = 0;
  uVar25 = 0;
  do {
    pxVar20 = (xmlNodePtr)0x0;
    do {
      iVar6 = (int)pxVar19;
      iVar5 = xmlMemBlocks();
      pxVar21 = gen_xmlNodePtr(uVar25,iVar6);
      iVar7 = (int)pxVar20;
      pxVar19 = gen_xmlNodePtr(iVar7,iVar6);
      xmlShellDir(0,0,pxVar21,pxVar19);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar25,pxVar21,nr_04);
      des_xmlNodePtr(iVar7,pxVar19,nr_05);
      xmlResetLastError();
      iVar6 = xmlMemBlocks();
      if (iVar5 != iVar6) {
        iVar6 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlShellDir",(ulong)(uint)(iVar6 - iVar5));
        iVar4 = iVar4 + 1;
        printf(" %d",0);
        printf(" %d",0);
        printf(" %d",(ulong)uVar25);
        printf(" %d");
        putchar(10);
        pxVar19 = pxVar20;
      }
      pxVar20 = (xmlNodePtr)(ulong)(iVar7 + 1U);
    } while (iVar7 + 1U != 3);
    uVar25 = uVar25 + 1;
  } while (uVar25 != 3);
  function_tests = function_tests + 1;
  iVar5 = 0;
  uVar25 = 0;
  do {
    pxVar20 = (xmlNodePtr)0x0;
    do {
      iVar7 = (int)pxVar19;
      iVar6 = xmlMemBlocks();
      pxVar21 = gen_xmlNodePtr(uVar25,iVar7);
      iVar8 = (int)pxVar20;
      pxVar19 = gen_xmlNodePtr(iVar8,iVar7);
      xmlShellDu(0,0,pxVar21,pxVar19);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar25,pxVar21,nr_06);
      des_xmlNodePtr(iVar8,pxVar19,nr_07);
      xmlResetLastError();
      iVar7 = xmlMemBlocks();
      if (iVar6 != iVar7) {
        iVar7 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlShellDu",(ulong)(uint)(iVar7 - iVar6));
        iVar5 = iVar5 + 1;
        printf(" %d",0);
        printf(" %d",0);
        printf(" %d",(ulong)uVar25);
        printf(" %d");
        putchar(10);
        pxVar19 = pxVar20;
      }
      pxVar20 = (xmlNodePtr)(ulong)(iVar8 + 1U);
    } while (iVar8 + 1U != 3);
    uVar25 = uVar25 + 1;
  } while (uVar25 != 3);
  function_tests = function_tests + 1;
  iVar6 = 0;
  uVar25 = 0;
  do {
    pxVar20 = (xmlNodePtr)0x0;
    do {
      iVar8 = (int)pxVar19;
      iVar7 = xmlMemBlocks();
      pxVar21 = gen_xmlNodePtr(uVar25,iVar8);
      iVar11 = (int)pxVar20;
      pxVar19 = gen_xmlNodePtr(iVar11,iVar8);
      xmlShellList(0,0,pxVar21,pxVar19);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar25,pxVar21,nr_08);
      des_xmlNodePtr(iVar11,pxVar19,nr_09);
      xmlResetLastError();
      iVar8 = xmlMemBlocks();
      if (iVar7 != iVar8) {
        iVar8 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlShellList",(ulong)(uint)(iVar8 - iVar7));
        iVar6 = iVar6 + 1;
        printf(" %d",0);
        printf(" %d",0);
        printf(" %d",(ulong)uVar25);
        printf(" %d");
        putchar(10);
        pxVar19 = pxVar20;
      }
      pxVar20 = (xmlNodePtr)(ulong)(iVar11 + 1U);
    } while (iVar11 + 1U != 3);
    uVar25 = uVar25 + 1;
  } while (uVar25 != 3);
  function_tests = function_tests + 1;
  iVar7 = 0;
  uVar25 = 0;
  do {
    pxVar20 = (xmlNodePtr)0x0;
    do {
      iVar11 = (int)pxVar19;
      iVar8 = xmlMemBlocks();
      pxVar21 = gen_xmlNodePtr(uVar25,iVar11);
      iVar12 = (int)pxVar20;
      pxVar19 = gen_xmlNodePtr(iVar12,iVar11);
      xmlShellLoad(0,0,pxVar21,pxVar19);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar25,pxVar21,nr_10);
      des_xmlNodePtr(iVar12,pxVar19,nr_11);
      xmlResetLastError();
      iVar11 = xmlMemBlocks();
      if (iVar8 != iVar11) {
        iVar11 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlShellLoad",(ulong)(uint)(iVar11 - iVar8));
        iVar7 = iVar7 + 1;
        printf(" %d",0);
        printf(" %d",0);
        printf(" %d",(ulong)uVar25);
        printf(" %d");
        putchar(10);
        pxVar19 = pxVar20;
      }
      pxVar20 = (xmlNodePtr)(ulong)(iVar12 + 1U);
    } while (iVar12 + 1U != 3);
    uVar25 = uVar25 + 1;
  } while (uVar25 != 3);
  function_tests = function_tests + 1;
  uVar25 = 0;
  local_34 = 0;
  do {
    iVar8 = xmlMemBlocks();
    pxVar22 = gen_xmlXPathObjectPtr(uVar25,(int)pxVar19);
    xmlShellPrintXPathResult(pxVar22);
    call_tests = call_tests + 1;
    if (pxVar22 != (xmlXPathObjectPtr)0x0) {
      xmlXPathFreeObject(pxVar22);
    }
    xmlResetLastError();
    iVar11 = xmlMemBlocks();
    if (iVar8 != iVar11) {
      iVar11 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlShellPrintXPathResult",(ulong)(uint)(iVar11 - iVar8));
      local_34 = local_34 + 1;
      pxVar19 = (xmlNodePtr)(ulong)uVar25;
      printf(" %d");
      putchar(10);
    }
    uVar25 = uVar25 + 1;
  } while (uVar25 != 5);
  function_tests = function_tests + 1;
  iVar8 = 0;
  uVar25 = 0;
  do {
    pxVar20 = (xmlNodePtr)0x0;
    do {
      iVar12 = (int)pxVar19;
      iVar11 = xmlMemBlocks();
      pxVar21 = gen_xmlNodePtr(uVar25,iVar12);
      iVar13 = (int)pxVar20;
      pxVar19 = gen_xmlNodePtr(iVar13,iVar12);
      xmlShellPwd(0,0,pxVar21,pxVar19);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar25,pxVar21,nr_12);
      des_xmlNodePtr(iVar13,pxVar19,nr_13);
      xmlResetLastError();
      iVar12 = xmlMemBlocks();
      if (iVar11 != iVar12) {
        iVar12 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlShellPwd",(ulong)(uint)(iVar12 - iVar11));
        iVar8 = iVar8 + 1;
        printf(" %d",0);
        printf(" %d",0);
        printf(" %d",(ulong)uVar25);
        printf(" %d");
        putchar(10);
        pxVar19 = pxVar20;
      }
      pxVar20 = (xmlNodePtr)(ulong)(iVar13 + 1U);
    } while (iVar13 + 1U != 3);
    uVar25 = uVar25 + 1;
  } while (uVar25 != 3);
  function_tests = function_tests + 1;
  iVar11 = 0;
  uVar25 = 0;
  do {
    pxVar20 = (xmlNodePtr)0x0;
    do {
      iVar13 = (int)pxVar19;
      iVar12 = xmlMemBlocks();
      pxVar21 = gen_xmlNodePtr(uVar25,iVar13);
      iVar14 = (int)pxVar20;
      pxVar19 = gen_xmlNodePtr(iVar14,iVar13);
      xmlShellSave(0,0,pxVar21,pxVar19);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar25,pxVar21,nr_14);
      des_xmlNodePtr(iVar14,pxVar19,nr_15);
      xmlResetLastError();
      iVar13 = xmlMemBlocks();
      if (iVar12 != iVar13) {
        iVar13 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlShellSave",(ulong)(uint)(iVar13 - iVar12));
        iVar11 = iVar11 + 1;
        printf(" %d",0);
        printf(" %d",0);
        printf(" %d",(ulong)uVar25);
        printf(" %d");
        putchar(10);
        pxVar19 = pxVar20;
      }
      pxVar20 = (xmlNodePtr)(ulong)(iVar14 + 1U);
    } while (iVar14 + 1U != 3);
    uVar25 = uVar25 + 1;
  } while (uVar25 != 3);
  function_tests = function_tests + 1;
  iVar12 = 0;
  uVar25 = 0;
  do {
    pxVar20 = (xmlNodePtr)0x0;
    do {
      iVar14 = (int)pxVar19;
      iVar13 = xmlMemBlocks();
      pxVar21 = gen_xmlNodePtr(uVar25,iVar14);
      iVar15 = (int)pxVar20;
      pxVar19 = gen_xmlNodePtr(iVar15,iVar14);
      xmlShellValidate(0,0,pxVar21,pxVar19);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar25,pxVar21,nr_16);
      des_xmlNodePtr(iVar15,pxVar19,nr_17);
      xmlResetLastError();
      iVar14 = xmlMemBlocks();
      if (iVar13 != iVar14) {
        iVar14 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlShellValidate",(ulong)(uint)(iVar14 - iVar13));
        iVar12 = iVar12 + 1;
        printf(" %d",0);
        printf(" %d",0);
        printf(" %d",(ulong)uVar25);
        printf(" %d");
        putchar(10);
        pxVar19 = pxVar20;
      }
      pxVar20 = (xmlNodePtr)(ulong)(iVar15 + 1U);
    } while (iVar15 + 1U != 3);
    uVar25 = uVar25 + 1;
  } while (uVar25 != 3);
  function_tests = function_tests + 1;
  iVar13 = 0;
  uVar25 = 0;
  do {
    pxVar20 = (xmlNodePtr)0x0;
    do {
      iVar15 = (int)pxVar19;
      iVar14 = xmlMemBlocks();
      pxVar21 = gen_xmlNodePtr(uVar25,iVar15);
      no = (int)pxVar20;
      pxVar19 = gen_xmlNodePtr(no,iVar15);
      xmlShellWrite(0,0,pxVar21,pxVar19);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar25,pxVar21,nr_18);
      des_xmlNodePtr(no,pxVar19,nr_19);
      xmlResetLastError();
      iVar15 = xmlMemBlocks();
      if (iVar14 != iVar15) {
        iVar15 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlShellWrite",(ulong)(uint)(iVar15 - iVar14));
        iVar13 = iVar13 + 1;
        printf(" %d",0);
        printf(" %d",0);
        printf(" %d",(ulong)uVar25);
        printf(" %d");
        putchar(10);
        pxVar19 = pxVar20;
      }
      pxVar20 = (xmlNodePtr)(ulong)(no + 1U);
    } while (no + 1U != 3);
    uVar25 = uVar25 + 1;
  } while (uVar25 != 3);
  function_tests = function_tests + 1;
  uVar25 = iVar29 + iVar9 + iVar10 + iVar3 + iVar4 + iVar5 + iVar6 + iVar7 + local_34 + iVar8 +
           iVar11 + iVar12 + iVar13;
  if (uVar25 != 0) {
    printf("Module debugXML: %d errors\n",(ulong)uVar25);
  }
  return uVar25;
}

Assistant:

static int
test_debugXML(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing debugXML : 25 of 28 functions ...\n");
    test_ret += test_xmlBoolToText();
    test_ret += test_xmlDebugCheckDocument();
    test_ret += test_xmlDebugDumpAttr();
    test_ret += test_xmlDebugDumpAttrList();
    test_ret += test_xmlDebugDumpDTD();
    test_ret += test_xmlDebugDumpDocument();
    test_ret += test_xmlDebugDumpDocumentHead();
    test_ret += test_xmlDebugDumpEntities();
    test_ret += test_xmlDebugDumpNode();
    test_ret += test_xmlDebugDumpNodeList();
    test_ret += test_xmlDebugDumpOneNode();
    test_ret += test_xmlDebugDumpString();
    test_ret += test_xmlLsCountNode();
    test_ret += test_xmlLsOneNode();
    test_ret += test_xmlShell();
    test_ret += test_xmlShellBase();
    test_ret += test_xmlShellCat();
    test_ret += test_xmlShellDir();
    test_ret += test_xmlShellDu();
    test_ret += test_xmlShellList();
    test_ret += test_xmlShellLoad();
    test_ret += test_xmlShellPrintXPathResult();
    test_ret += test_xmlShellPwd();
    test_ret += test_xmlShellSave();
    test_ret += test_xmlShellValidate();
    test_ret += test_xmlShellWrite();

    if (test_ret != 0)
	printf("Module debugXML: %d errors\n", test_ret);
    return(test_ret);
}